

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

int lddmc_sat_one(MDD mdd,uint32_t *values,size_t count)

{
  uint32_t uVar1;
  mddnode_t n_00;
  uint64_t mdd_00;
  mddnode_t n;
  size_t count_local;
  uint32_t *values_local;
  MDD mdd_local;
  
  if (mdd == 0) {
    mdd_local._4_4_ = 0;
  }
  else if (mdd == 1) {
    mdd_local._4_4_ = 1;
  }
  else {
    if (count == 0) {
      __assert_fail("count != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0x89c,"int lddmc_sat_one(MDD, uint32_t *, size_t)");
    }
    n_00 = LDD_GETNODE(mdd);
    uVar1 = mddnode_getvalue(n_00);
    *values = uVar1;
    mdd_00 = mddnode_getdown(n_00);
    mdd_local._4_4_ = lddmc_sat_one(mdd_00,values + 1,count - 1);
  }
  return mdd_local._4_4_;
}

Assistant:

int
lddmc_sat_one(MDD mdd, uint32_t* values, size_t count)
{
    if (mdd == lddmc_false) return 0;
    if (mdd == lddmc_true) return 1;
    assert(count != 0);
    mddnode_t n = LDD_GETNODE(mdd);
    *values = mddnode_getvalue(n);
    return lddmc_sat_one(mddnode_getdown(n), values+1, count-1);
}